

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::prepareTexture
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture)

{
  GLint *pageSizeX;
  GLint *pageSizeY;
  int iVar1;
  int iVar2;
  GLenum err;
  GLint GVar3;
  TextureFormat TVar4;
  
  gl4cts::Texture::Generate(gl,texture);
  (*gl->bindTexture)(target,*texture);
  err = (*gl->getError)();
  glu::checkError(err,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0xb5);
  GVar3 = SparseTextureUtils::getTargetDepth(target);
  (this->mState).minDepth = GVar3;
  pageSizeX = &(this->mState).pageSizeX;
  pageSizeY = &(this->mState).pageSizeY;
  SparseTextureUtils::getTexturePageSizes
            (gl,target,format,pageSizeX,pageSizeY,&(this->mState).pageSizeZ);
  if ((target == 0x9009) || (target == 0x8513)) {
    iVar1 = *pageSizeX;
    iVar2 = *pageSizeY;
    if (iVar2 < iVar1) {
      *pageSizeY = iVar1;
    }
    else if (iVar1 < iVar2) {
      *pageSizeX = iVar2;
    }
  }
  (this->mState).width = (this->mState).pageSizeX * 2;
  (this->mState).height = (this->mState).pageSizeY * 2;
  (this->mState).depth = (this->mState).pageSizeZ * (this->mState).minDepth * 2;
  TVar4 = glu::mapGLInternalFormat(format);
  (this->mState).format = TVar4;
  return true;
}

Assistant:

bool SparseTextureCommitmentTestCase::prepareTexture(const Functions& gl, GLint target, GLint format, GLuint& texture)
{
	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	mState.minDepth = SparseTextureUtils::getTargetDepth(target);
	SparseTextureUtils::getTexturePageSizes(gl, target, format, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ);

	//The <width> and <height> has to be equal for cube map textures
	if (target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		if (mState.pageSizeX > mState.pageSizeY)
			mState.pageSizeY = mState.pageSizeX;
		else if (mState.pageSizeX < mState.pageSizeY)
			mState.pageSizeX = mState.pageSizeY;
	}

	mState.width  = 2 * mState.pageSizeX;
	mState.height = 2 * mState.pageSizeY;
	mState.depth  = 2 * mState.pageSizeZ * mState.minDepth;

	mState.format = glu::mapGLInternalFormat(format);

	return true;
}